

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O3

ostream * Gs::operator<<(ostream *stream,Matrix<float,_2UL,_2UL> *mat)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  ostream *poVar7;
  size_t *psVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong local_70;
  char *local_68;
  long local_60;
  char local_58 [16];
  size_t local_48;
  Matrix<float,_2UL,_2UL> *local_40;
  size_t local_38;
  
  psVar8 = &local_48;
  uVar11 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    *psVar8 = 0;
    uVar10 = 0;
    uVar5 = 0;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      sVar4 = Details::Length<float>(mat->m_ + (uVar5 | uVar11));
      if (uVar10 <= sVar4) {
        uVar10 = sVar4;
      }
      *psVar8 = uVar10;
      uVar5 = 1;
      bVar1 = false;
    } while (bVar9);
    uVar11 = 2;
    psVar8 = &local_38;
    bVar1 = false;
  } while (bVar2);
  local_70 = 0;
  local_40 = mat;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar3 = 0x5c;
    if (bVar2) {
      uVar3 = 0x2f;
    }
    local_68._0_1_ = uVar3;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_68,1);
    psVar8 = &local_48;
    uVar11 = 0;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      sVar4 = *psVar8;
      sVar6 = Details::Length<float>(mat->m_ + (uVar11 | local_70));
      local_68 = local_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,((char)sVar4 - (char)sVar6) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_68,local_60);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      poVar7 = std::ostream::_M_insert<double>((double)mat->m_[uVar11 | local_70]);
      local_68._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_68,1);
      mat = local_40;
      uVar11 = 2;
      psVar8 = &local_38;
      bVar1 = false;
    } while (bVar9);
    uVar3 = 0x2f;
    if (bVar2) {
      uVar3 = 0x5c;
    }
    local_68 = (char *)CONCAT71(local_68._1_7_,uVar3);
    local_70 = 1;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_68,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    bVar1 = false;
  } while (bVar2);
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}